

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O2

void __thiscall UKF::ProcessMeasurement(UKF *this,MeasurementPackage *meas_package)

{
  double delta_t;
  VectorXd z_pred;
  MatrixXd Tc;
  MatrixXd S;
  VectorXd local_d8;
  ConstantReturnType local_c8;
  ConstantReturnType local_b0;
  double local_98;
  ConstantReturnType local_90;
  MeasurementPackage local_78;
  MeasurementPackage local_58;
  MeasurementPackage local_38;
  
  if (this->is_initialized_ == false) {
    MeasurementPackage::MeasurementPackage(&local_38,meas_package);
    SetInitialValues(this,&local_38);
    free(local_38.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    this->previous_timestamp_ = meas_package->timestamp_;
    this->is_initialized_ = true;
  }
  else {
    delta_t = (double)(meas_package->timestamp_ - this->previous_timestamp_) / 1000000.0;
    while (0.1 < delta_t) {
      local_98 = delta_t;
      Prediction(this,0.05);
      delta_t = local_98 + -0.05;
    }
    Prediction(this,delta_t);
    if (meas_package->sensor_type_ == LASER) {
      if (this->use_laser_ != true) {
        return;
      }
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_b0,(long)this->n_zlas_)
      ;
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_d8,
                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_b0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                (&local_c8,(long)this->n_zlas_,(long)this->n_zlas_);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_b0,
                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_c8);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                (&local_90,(long)this->n_x_,(long)this->n_zlas_);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_c8,
                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_90);
      PredictLidarMeasurement(this,&local_d8,(MatrixXd *)&local_b0,(MatrixXd *)&local_c8);
      MeasurementPackage::MeasurementPackage(&local_78,meas_package);
      UpdateLidar(this,&local_78,&local_d8,(MatrixXd *)&local_c8,(MatrixXd *)&local_b0);
      local_58.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data =
           local_78.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_storage.m_data;
    }
    else {
      if (meas_package->sensor_type_ != RADAR) {
        return;
      }
      if (this->use_radar_ != true) {
        return;
      }
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_b0,(long)this->n_zrad_)
      ;
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_d8,
                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_b0);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                (&local_c8,(long)this->n_zrad_,(long)this->n_zrad_);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_b0,
                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_c8);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                (&local_90,(long)this->n_x_,(long)this->n_zrad_);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_c8,
                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_90);
      PredictRadarMeasurement(this,&local_d8,(MatrixXd *)&local_b0,(MatrixXd *)&local_c8);
      MeasurementPackage::MeasurementPackage(&local_58,meas_package);
      UpdateRadar(this,&local_58,&local_d8,(MatrixXd *)&local_c8,(MatrixXd *)&local_b0);
    }
    free(local_58.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    this->previous_timestamp_ = meas_package->timestamp_;
    free((void *)local_c8.m_rows.m_value);
    free((void *)local_b0.m_rows.m_value);
    free(local_d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  return;
}

Assistant:

void UKF::ProcessMeasurement(const MeasurementPackage meas_package) {
  
  if (!is_initialized_) {

    //  Initialize the state x_,state covariance matrix P_
    SetInitialValues(meas_package);
    previous_timestamp_ = meas_package.timestamp_;
    is_initialized_ = true;

    return;
  }


  double delta_t =  (meas_package.timestamp_ - previous_timestamp_) / 1000000.0;
  while (delta_t > 0.1)
  {
//  cout<< "delta_t: " << delta_t << endl;
//  cout << "Press ENTER to continue...";
//  cin.ignore( std::numeric_limits<std::streamsize>::max(), '\n' );
  
  const double dt = 0.05;
  Prediction(dt);
  delta_t -= dt;
  }

  Prediction(delta_t);


  if ( meas_package.sensor_type_ == MeasurementPackage::RADAR && use_radar_ ) {
    // Radar updates 
    // rho, phi, rho_dot

    //mean predicted measurement
    VectorXd z_pred = VectorXd::Zero(n_zrad_);
    //measurement covariance matrix S
    MatrixXd S = MatrixXd::Zero(n_zrad_,n_zrad_);
    // cross-correlation matrix Tc
    MatrixXd Tc = MatrixXd::Zero(n_x_, n_zrad_);
    // get predictions for x,S and Tc in RADAR space
    PredictRadarMeasurement(z_pred, S, Tc);  
    // update the state using the RADAR measurement
    UpdateRadar(meas_package, z_pred, Tc, S);
    // update the time
    previous_timestamp_ = meas_package.timestamp_;

  } 

  else if ( meas_package.sensor_type_ == MeasurementPackage::LASER && use_laser_ ) {
    // Laser updates
    // px, py

    //mean predicted measurement
    VectorXd z_pred = VectorXd::Zero(n_zlas_);
    //measurement covariance matrix S
    MatrixXd S = MatrixXd::Zero(n_zlas_,n_zlas_);
    // cross-correlation matrix Tc
    MatrixXd Tc = MatrixXd::Zero(n_x_, n_zlas_);
    // get predictions for x,S and Tc in Lidar space
    PredictLidarMeasurement(z_pred, S, Tc);
    // update the state using the LIDAR measurement
    UpdateLidar(meas_package, z_pred, Tc, S);
    // update the time
    previous_timestamp_ = meas_package.timestamp_;

  }

  return;

}